

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfTcpConnection.c
# Opt level: O2

sbfTcpConnection_conflict
sbfTcpConnection_wrap
          (sbfLog log,int socket,int isUnix,int disableNagles,sbfTcpConnectionAddress *address)

{
  int iVar1;
  sbfTcpConnection_conflict psVar2;
  long lVar3;
  sbfTcpConnectionAddress *psVar4;
  byte bVar5;
  int flag;
  
  bVar5 = 0;
  evutil_make_socket_closeonexec(socket);
  evutil_make_socket_nonblocking(socket);
  if (disableNagles != 0) {
    flag = 1;
    iVar1 = setsockopt(socket,6,1,&flag,4);
    if (iVar1 < 0) {
      sbfLog_log(log,3,"failed to disabled nagles on tcp-socket");
    }
  }
  psVar2 = (sbfTcpConnection_conflict)sbfMemory_calloc(1,0xd0);
  psVar2->mLog = log;
  psVar2->mSocket = socket;
  psVar2->mIsUnix = isUnix;
  psVar4 = &psVar2->mPeer;
  for (lVar3 = 0x1c; lVar3 != 0; lVar3 = lVar3 + -1) {
    *(undefined4 *)psVar4 = *(undefined4 *)address;
    address = (sbfTcpConnectionAddress *)((long)address + (ulong)bVar5 * -8 + 4);
    psVar4 = (sbfTcpConnectionAddress *)((long)psVar4 + (ulong)bVar5 * -8 + 4);
  }
  return psVar2;
}

Assistant:

sbfTcpConnection
sbfTcpConnection_wrap (sbfLog log,
                       int socket,
                       int isUnix,
                       int disableNagles,
                       sbfTcpConnectionAddress* address)
{
    sbfTcpConnection tc;

    evutil_make_socket_closeonexec (socket);
    evutil_make_socket_nonblocking (socket);

    if (disableNagles)
    {
        int flag = 1;
        int result = setsockopt (socket,
                                 IPPROTO_TCP,
                                 TCP_NODELAY,
                                 (char *)&flag,
                                 sizeof (int));
        if (result < 0)
            sbfLog_err (log, "failed to disabled nagles on tcp-socket");
    }

    tc = xcalloc (1, sizeof *tc);
    tc->mLog = log;
    tc->mSocket = socket;
    tc->mIsUnix = isUnix;
    memcpy (&tc->mPeer, address, sizeof(sbfTcpConnectionAddress));

    return tc;
}